

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O1

ModGroup * __thiscall
RenX_ModSystemPlugin::getGroupByName
          (RenX_ModSystemPlugin *this,string_view name,ModGroup *defaultGroup)

{
  bool bVar1;
  _List_node_base *p_Var2;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  
  p_Var2 = (_List_node_base *)&this->groups;
  do {
    p_Var2 = (((_List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
                *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var2 == (_List_node_base *)&this->groups) {
      return defaultGroup;
    }
    lhs._M_str = (char *)p_Var2[6]._M_next;
    lhs._M_len = (size_t)p_Var2[6]._M_prev;
    bVar1 = jessilib::equalsi<char,char>(lhs,name);
  } while (!bVar1);
  return (ModGroup *)(p_Var2 + 1);
}

Assistant:

RenX_ModSystemPlugin::ModGroup *RenX_ModSystemPlugin::getGroupByName(std::string_view name, ModGroup *defaultGroup) const {
	for (const auto& group : groups) {
		if (jessilib::equalsi(group.name, name)) {
			return const_cast<ModGroup*>(&group);
		}
	}

	return defaultGroup;
}